

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

void __thiscall QString::QString(QString *this,qsizetype size,QChar ch)

{
  char16_t *pcVar1;
  undefined1 auVar2 [16];
  long lVar3;
  char16_t __tmp;
  long in_FS_OFFSET;
  pair<QTypedArrayData<char16_t>_*,_char16_t_*> local_40;
  qsizetype local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->d).d = (Data *)0x0;
  (this->d).ptr = (char16_t *)0x0;
  (this->d).size = 0;
  if (size < 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = L"";
    local_40 = (pair<QTypedArrayData<char16_t>_*,_char16_t_*>)(auVar2 << 0x40);
    local_30 = 0;
    QArrayDataPointer<char16_t>::operator=(&this->d,(QArrayDataPointer<char16_t> *)&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_40);
  }
  else {
    local_40 = QTypedArrayData<char16_t>::allocate(size,KeepSize);
    local_30 = size;
    QArrayDataPointer<char16_t>::operator=(&this->d,(QArrayDataPointer<char16_t> *)&local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_40);
    pcVar1 = (this->d).ptr;
    if (pcVar1 == (char16_t *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        qBadAlloc();
      }
      goto LAB_002ee65e;
    }
    pcVar1[size] = L'\0';
    for (lVar3 = 0; size * 2 != lVar3; lVar3 = lVar3 + 2) {
      *(char16_t *)((long)pcVar1 + lVar3) = ch.ucs;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_002ee65e:
  __stack_chk_fail();
}

Assistant:

QString::QString(qsizetype size, QChar ch)
{
    if (size <= 0) {
        d = DataPointer::fromRawData(&_empty, 0);
    } else {
        d = DataPointer(size, size);
        Q_CHECK_PTR(d.data());
        d.data()[size] = '\0';
        char16_t *b = d.data();
        char16_t *e = d.data() + size;
        const char16_t value = ch.unicode();
        std::fill(b, e, value);
    }
}